

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::(anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,3ul>>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
          *values,uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
          *dest)

{
  uint uVar1;
  long lVar2;
  pointer piVar3;
  ulong uVar4;
  long lVar5;
  value_type_conflict vVar6;
  undefined4 in_register_0000000c;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  plVar7 = (long *)CONCAT44(in_register_0000000c,elementSize);
  if (indices == (vector<int,_std::allocator<int>_> *)0x0) {
    local_90.m_error._M_dataplus._M_p = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_90);
  }
  else if (*plVar7 == plVar7[1]) {
    std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
    operator=((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
               *)indices,
              (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
               *)this);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = true;
  }
  else {
    if (((int)values != 0) &&
       (uVar8 = (ulong)values & 0xffffffff,
       (ulong)((*(long *)(this + 8) - *(long *)this) / 0xc) % uVar8 == 0)) {
      std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
      resize((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
              *)indices,(plVar7[1] - *plVar7 >> 2) * uVar8);
      invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vVar6 = true;
      for (local_90.m_error._M_dataplus._M_p = (pointer)0x0;
          local_90.m_error._M_dataplus._M_p < (undefined1 *)(plVar7[1] - *plVar7 >> 2);
          local_90.m_error._M_dataplus._M_p = local_90.m_error._M_dataplus._M_p + 1) {
        uVar1 = *(uint *)(*plVar7 + (long)local_90.m_error._M_dataplus._M_p * 4);
        if (((int)uVar1 < 0) ||
           (uVar10 = ((ulong)uVar1 + 1) * uVar8, uVar4 = (*(long *)(this + 8) - *(long *)this) / 0xc
           , uVar4 <= uVar10 && uVar10 - uVar4 != 0)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&invalidIndices,(value_type_conflict5 *)&local_90);
          vVar6 = false;
        }
        else {
          lVar5 = uVar8 * 0xc * (long)local_90.m_error._M_dataplus._M_p;
          lVar9 = (ulong)uVar1 * uVar8 * 0xc;
          uVar4 = uVar8;
          while (bVar11 = uVar4 != 0, uVar4 = uVar4 - 1, bVar11) {
            lVar2 = *(long *)this;
            piVar3 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            *(undefined4 *)((long)piVar3 + lVar5 + 8) = *(undefined4 *)(lVar2 + 8 + lVar9);
            *(undefined8 *)((long)piVar3 + lVar5) = *(undefined8 *)(lVar2 + lVar9);
            lVar5 = lVar5 + 0xc;
            lVar9 = lVar9 + 0xc;
          }
        }
      }
      if (invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value = vVar6;
      }
      else {
        tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&invalidIndices,5);
        std::operator+(&local_70,"Invalid indices found: ",&local_50);
        local_90.m_error._M_dataplus._M_p = (pointer)&local_90.m_error.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) {
          local_90.m_error.field_2._8_8_ = local_70.field_2._8_8_;
        }
        else {
          local_90.m_error._M_dataplus._M_p = local_70._M_dataplus._M_p;
        }
        local_90.m_error._M_string_length = local_70._M_string_length;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,&local_90);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value = false;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}